

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AgentInvoker.h
# Opt level: O0

int __thiscall
aeron::concurrent::AgentInvoker<aeron::ClientConductor>::close
          (AgentInvoker<aeron::ClientConductor> *this,int __fd)

{
  AgentInvoker<aeron::ClientConductor> *extraout_RAX;
  
  if ((this->m_isClosed & 1U) == 0) {
    this->m_isRunning = false;
    this->m_isClosed = true;
    ClientConductor::onClose(this->m_agent);
    this = extraout_RAX;
  }
  return (int)this;
}

Assistant:

inline void close()
    {
        try
        {
            if (!m_isClosed)
            {
                m_isRunning = false;
                m_isClosed = true;
                m_agent.onClose();
            }
        }
        catch (const util::SourcedException &exception)
        {
            m_exceptionHandler(exception);
        }
    }